

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O3

int __thiscall
RuntimeObjectSystem::TestBuildAllRuntimeHeaders
          (RuntimeObjectSystem *this,ITestBuildNotifier *callback,bool bTestFileTracking)

{
  ICompilerLogger *pIVar1;
  int iVar2;
  pointer pPVar3;
  pointer pPVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  pointer *ppPVar8;
  uint uVar9;
  long lVar10;
  ushort uVar11;
  pointer this_00;
  TFileList filesToTest;
  vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_> local_68;
  string local_50;
  
  if (callback == (ITestBuildNotifier *)0x0) {
    callback = (ITestBuildNotifier *)this;
  }
  pPVar3 = (this->m_Projects).
           super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar4 = (this->m_Projects).
           super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pPVar4 - (long)pPVar3 != 0) {
    uVar5 = ((long)pPVar4 - (long)pPVar3 >> 3) * -0x7dc11f7047dc11f7;
    ppPVar8 = &(pPVar3->m_RuntimeFileList).
               super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    uVar11 = 1;
    lVar10 = 0;
    do {
      lVar10 = lVar10 + ((long)*ppPVar8 - (long)((_Vector_impl_data *)(ppPVar8 + -1))->_M_start >> 3
                        ) * -0x3333333333333333;
      uVar6 = (ulong)uVar11;
      ppPVar8 = ppPVar8 + 0x39;
      uVar11 = uVar11 + 1;
    } while (uVar6 <= uVar5 && uVar5 - uVar6 != 0);
    if (lVar10 != 0) goto LAB_0010fb05;
  }
  (*(((RuntimeObjectSystem *)callback)->super_IRuntimeObjectSystem).super_ITestBuildNotifier.
    _vptr_ITestBuildNotifier[2])(callback,0,1);
  pPVar3 = (this->m_Projects).
           super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar4 = (this->m_Projects).
           super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
           ._M_impl.super__Vector_impl_data._M_finish;
LAB_0010fb05:
  if (pPVar4 != pPVar3) {
    uVar5 = 0;
    uVar9 = 0;
    iVar7 = 0;
    do {
      std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::vector
                (&local_68,&pPVar3[uVar5].m_RuntimeFileList);
      for (this_00 = local_68.
                     super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          this_00 !=
          local_68.super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
          ._M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
        FileSystemUtils::Path::Extension_abi_cxx11_(&local_50,this_00);
        iVar2 = std::__cxx11::string::compare((char *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (iVar2 == 0) {
          iVar2 = TestBuildFile(this->m_pCompilerLogger,this,this_00,callback,bTestFileTracking);
          if (iVar2 < 0) {
            std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::~vector
                      (&local_68);
            return iVar7 - iVar2;
          }
          iVar7 = iVar7 + iVar2;
        }
      }
      std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::~vector(&local_68)
      ;
      uVar9 = uVar9 + 1;
      uVar5 = (ulong)(uVar9 & 0xffff);
      pPVar3 = (this->m_Projects).
               super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = ((long)(this->m_Projects).
                     super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
              -0x7dc11f7047dc11f7;
    } while (uVar5 <= uVar6 && uVar6 - uVar5 != 0);
    if (iVar7 != 0) {
      pIVar1 = this->m_pCompilerLogger;
      if (pIVar1 != (ICompilerLogger *)0x0) {
        (*(code *)**(undefined8 **)pIVar1)(pIVar1,"Tests Failed: %d\n",iVar7);
        return iVar7;
      }
      return iVar7;
    }
  }
  pIVar1 = this->m_pCompilerLogger;
  if (pIVar1 != (ICompilerLogger *)0x0) {
    (**(code **)(*(long *)pIVar1 + 0x10))(pIVar1,"All Tests Passed\n");
  }
  return 0;
}

Assistant:

int RuntimeObjectSystem::TestBuildAllRuntimeHeaders(      ITestBuildNotifier* callback, bool bTestFileTracking )
{
    ITestBuildNotifier* failCallbackLocal = callback;
    if( !failCallbackLocal )
    {
        failCallbackLocal = this;
    }

    int numErrors = 0;

    size_t numFilesToBuild = 0;
    for( unsigned short proj = 0; proj < m_Projects.size( ); ++proj )
    {
        numFilesToBuild += m_Projects[ proj ].m_RuntimeFileList.size( );
    }

    if( 0 == numFilesToBuild )
    {
        failCallbackLocal->TestBuildCallback( NULL, TESTBUILDRRESULT_NO_FILES_TO_BUILD );
    }

    for( unsigned short proj = 0; proj < m_Projects.size(); ++proj )
    {
        TFileList filesToTest = m_Projects[ proj ].m_RuntimeFileList; // m_RuntimeFileList could change if file content changes (new includes or source dependencies) so make copy to ensure iterators valid.
        for( TFileList::iterator it = filesToTest.begin( ); it != filesToTest.end( ); ++it )
        {
            const Path& file = *it;
            if( file.Extension() == ".h" ) // exclude headers, use TestBuildAllRuntimeHeaders
            {
                int fileErrors = TestBuildFile( m_pCompilerLogger, this, file, failCallbackLocal, bTestFileTracking );
                if( fileErrors < 0 )
                {
                    // this means exit, and the number of errors is -ve so remove
                    return numErrors - fileErrors;
                }
                numErrors += fileErrors;
            }
        }
    }

    
    if( 0 == numErrors )
    {
        if( m_pCompilerLogger ) { m_pCompilerLogger->LogInfo("All Tests Passed\n"); }
    }
    else
    {
        if( m_pCompilerLogger ) { m_pCompilerLogger->LogError("Tests Failed: %d\n", numErrors); }
    }
    return numErrors;
}